

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TotalMultiplicity.test.cpp
# Opt level: O2

void verifyChunk(TotalMultiplicity *chunk)

{
  long lVar1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  double local_d8;
  undefined1 local_d0 [8];
  undefined8 local_c8;
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_50;
  double *local_40;
  WithinRelMatcher *local_38;
  
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x7d;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0xf;
  capturedExpression.m_start = "2 == chunk.NP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_d0,capturedExpression,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x10;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x7e;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x19;
  capturedExpression_00.m_start = "2 == chunk.numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_d0,capturedExpression_00,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x10;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x7f;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0xf;
  capturedExpression_01.m_start = "1 == chunk.NR()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_d0,capturedExpression_01,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 8;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_c8._4_4_ = 1;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x80;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x27;
  capturedExpression_02.m_start = "1 == chunk.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_d0,capturedExpression_02,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 8;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_c8._4_4_ = 1;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x81;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x17;
  capturedExpression_03.m_start = "1 == chunk.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_d0,capturedExpression_03,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 8;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73b0;
  local_c8._4_4_ = 1;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x82;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x17;
  capturedExpression_04.m_start = "1 == chunk.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_d0,capturedExpression_04,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 8;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73b0;
  local_c8._4_4_ = 1;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x83;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x13;
  capturedExpression_05.m_start = "5 == chunk.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_d0,capturedExpression_05,
             ContinueOnFailure);
  local_b8[0]._8_8_ =
       *(chunk->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_c8._1_1_ = local_b8[0]._8_8_ == 5;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_c8._4_4_ = 5;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x84;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x13;
  capturedExpression_06.m_start = "2 == chunk.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_d0,capturedExpression_06,
             ContinueOnFailure);
  local_b8[0]._8_8_ =
       *(chunk->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_c8._1_1_ = local_b8[0]._8_8_ == 2;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x85;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x20;
  capturedExpression_07.m_start = "1 == chunk.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_d0,capturedExpression_07,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 8;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73b0;
  local_c8._4_4_ = 1;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x86;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x1e;
  capturedExpression_08.m_start = "1 == chunk.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_d0,capturedExpression_08,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 8;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73b0;
  local_c8._4_4_ = 1;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x87;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x1c;
  capturedExpression_09.m_start = "5 == chunk.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_d0,capturedExpression_09,
             ContinueOnFailure);
  local_b8[0]._8_8_ =
       *(chunk->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_c8._1_1_ = local_b8[0]._8_8_ == 5;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_c8._4_4_ = 5;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x88;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x1a;
  capturedExpression_10.m_start = "2 == chunk.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)local_d0,capturedExpression_10,
             ContinueOnFailure);
  local_b8[0]._8_8_ =
       *(chunk->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_c8._1_1_ = local_b8[0]._8_8_ == 2;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x89;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x15;
  capturedExpression_11.m_start = "2 == chunk.E().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_11,(SourceLineInfo *)local_d0,capturedExpression_11,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x10;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73b0;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x8a;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x1c;
  capturedExpression_12.m_start = "2 == chunk.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_12,(SourceLineInfo *)local_d0,capturedExpression_12,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x10;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73b0;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x8b;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x15;
  capturedExpression_13.m_start = "2 == chunk.x().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_13,(SourceLineInfo *)local_d0,capturedExpression_13,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x10;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73b0;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x8c;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x15;
  capturedExpression_14.m_start = "2 == chunk.Y().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_14,(SourceLineInfo *)local_d0,capturedExpression_14,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x10;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73b0;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x8d;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x22;
  capturedExpression_15.m_start = "2 == chunk.multiplicities().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_15,(SourceLineInfo *)local_d0,capturedExpression_15,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x10;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73b0;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x8e;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x15;
  capturedExpression_16.m_start = "2 == chunk.y().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_16,(SourceLineInfo *)local_d0,capturedExpression_16,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_TabulationRecord).yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->super_TabulationRecord).yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x10;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73b0;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x8f;
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  capturedExpression_17.m_size = 0x1d;
  capturedExpression_17.m_start = "1., WithinRel( chunk.E()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_17,(SourceLineInfo *)local_d0,capturedExpression_17,
             ContinueOnFailure);
  local_d8 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(chunk->super_TabulationRecord).xValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x90;
  macroName_18.m_size = 10;
  macroName_18.m_start = "CHECK_THAT";
  capturedExpression_18.m_size = 0x1d;
  capturedExpression_18.m_start = "3., WithinRel( chunk.E()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_18,(SourceLineInfo *)local_d0,capturedExpression_18,
             ContinueOnFailure);
  local_d8 = 3.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_TabulationRecord).xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x91;
  macroName_19.m_size = 10;
  macroName_19.m_start = "CHECK_THAT";
  capturedExpression_19.m_size = 0x24;
  capturedExpression_19.m_start = "1., WithinRel( chunk.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_19,(SourceLineInfo *)local_d0,capturedExpression_19,
             ContinueOnFailure);
  local_d8 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(chunk->super_TabulationRecord).xValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x92;
  macroName_20.m_size = 10;
  macroName_20.m_start = "CHECK_THAT";
  capturedExpression_20.m_size = 0x24;
  capturedExpression_20.m_start = "3., WithinRel( chunk.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_20,(SourceLineInfo *)local_d0,capturedExpression_20,
             ContinueOnFailure);
  local_d8 = 3.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_TabulationRecord).xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x93;
  macroName_21.m_size = 10;
  macroName_21.m_start = "CHECK_THAT";
  capturedExpression_21.m_size = 0x1d;
  capturedExpression_21.m_start = "1., WithinRel( chunk.x()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_21,(SourceLineInfo *)local_d0,capturedExpression_21,
             ContinueOnFailure);
  local_d8 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(chunk->super_TabulationRecord).xValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x94;
  macroName_22.m_size = 10;
  macroName_22.m_start = "CHECK_THAT";
  capturedExpression_22.m_size = 0x1d;
  capturedExpression_22.m_start = "3., WithinRel( chunk.x()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_22,(SourceLineInfo *)local_d0,capturedExpression_22,
             ContinueOnFailure);
  local_d8 = 3.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_TabulationRecord).xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x95;
  macroName_23.m_size = 10;
  macroName_23.m_start = "CHECK_THAT";
  capturedExpression_23.m_size = 0x1d;
  capturedExpression_23.m_start = "2., WithinRel( chunk.Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_23,(SourceLineInfo *)local_d0,capturedExpression_23,
             ContinueOnFailure);
  local_d8 = 2.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(chunk->super_TabulationRecord).yValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x96;
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  capturedExpression_24.m_size = 0x1d;
  capturedExpression_24.m_start = "4., WithinRel( chunk.Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_24,(SourceLineInfo *)local_d0,capturedExpression_24,
             ContinueOnFailure);
  local_d8 = 4.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_TabulationRecord).yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x97;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x2a;
  capturedExpression_25.m_start = "2., WithinRel( chunk.multiplicities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_25,(SourceLineInfo *)local_d0,capturedExpression_25,
             ContinueOnFailure);
  local_d8 = 2.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(chunk->super_TabulationRecord).yValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x98;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x2a;
  capturedExpression_26.m_start = "4., WithinRel( chunk.multiplicities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_26,(SourceLineInfo *)local_d0,capturedExpression_26,
             ContinueOnFailure);
  local_d8 = 4.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_TabulationRecord).yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x99;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x1d;
  capturedExpression_27.m_start = "2., WithinRel( chunk.y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_27,(SourceLineInfo *)local_d0,capturedExpression_27,
             ContinueOnFailure);
  local_d8 = 2.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(chunk->super_TabulationRecord).yValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x9a;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x1d;
  capturedExpression_28.m_start = "4., WithinRel( chunk.y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_28,(SourceLineInfo *)local_d0,capturedExpression_28,
             ContinueOnFailure);
  local_d8 = 4.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_TabulationRecord).yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73f0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17c48c;
  local_c8 = (pointer)0x9c;
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  capturedExpression_29.m_size = 0xf;
  capturedExpression_29.m_start = "3 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_29,(SourceLineInfo *)local_d0,capturedExpression_29,
             ContinueOnFailure);
  local_b8[0]._8_8_ = njoy::ENDFtk::TabulationRecord::NC(&chunk->super_TabulationRecord);
  local_c8._1_1_ = local_b8[0]._8_8_ == 3;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_c8._4_4_ = 3;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const TotalMultiplicity& chunk ) {

  CHECK( 2 == chunk.NP() );
  CHECK( 2 == chunk.numberPoints() );
  CHECK( 1 == chunk.NR() );
  CHECK( 1 == chunk.numberInterpolationRegions() );
  CHECK( 1 == chunk.INT().size() );
  CHECK( 1 == chunk.NBT().size() );
  CHECK( 5 == chunk.INT()[0] );
  CHECK( 2 == chunk.NBT()[0] );
  CHECK( 1 == chunk.interpolants().size() );
  CHECK( 1 == chunk.boundaries().size() );
  CHECK( 5 == chunk.interpolants()[0] );
  CHECK( 2 == chunk.boundaries()[0] );
  CHECK( 2 == chunk.E().size() );
  CHECK( 2 == chunk.energies().size() );
  CHECK( 2 == chunk.x().size() );
  CHECK( 2 == chunk.Y().size() );
  CHECK( 2 == chunk.multiplicities().size() );
  CHECK( 2 == chunk.y().size() );
  CHECK_THAT( 1., WithinRel( chunk.E()[0] ) );
  CHECK_THAT( 3., WithinRel( chunk.E()[1] ) );
  CHECK_THAT( 1., WithinRel( chunk.energies()[0] ) );
  CHECK_THAT( 3., WithinRel( chunk.energies()[1] ) );
  CHECK_THAT( 1., WithinRel( chunk.x()[0] ) );
  CHECK_THAT( 3., WithinRel( chunk.x()[1] ) );
  CHECK_THAT( 2., WithinRel( chunk.Y()[0] ) );
  CHECK_THAT( 4., WithinRel( chunk.Y()[1] ) );
  CHECK_THAT( 2., WithinRel( chunk.multiplicities()[0] ) );
  CHECK_THAT( 4., WithinRel( chunk.multiplicities()[1] ) );
  CHECK_THAT( 2., WithinRel( chunk.y()[0] ) );
  CHECK_THAT( 4., WithinRel( chunk.y()[1] ) );

  CHECK( 3 == chunk.NC() );
}